

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O1

bool __thiscall wmj::fileWatcher::fileWatcher::watchOnce(fileWatcher *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int *__buf;
  ssize_t sVar4;
  int *piVar5;
  bool bVar6;
  
  __buf = (int *)operator_new__((this->file_name)._M_string_length * 10 + 0xaa);
  sVar4 = read(this->inotify_fd,__buf,100);
  if (sVar4 < 1) goto LAB_00102a5f;
  uVar2 = 0;
  piVar5 = __buf;
  do {
    if (*piVar5 == this->wd) {
      uVar2 = uVar2 | piVar5[1];
    }
    piVar5 = (int *)((long)piVar5 + (ulong)(uint)piVar5[3] + 0x10);
  } while (piVar5 < (int *)((long)__buf + sVar4));
  bVar6 = true;
  if ((uVar2 & 0x8008) == 8) {
LAB_00102a51:
    operator_delete__(__buf);
    bVar1 = false;
  }
  else {
    bVar6 = (uVar2 & 0xc00) != 0;
    if ((uVar2 & 0xc04) != 0) {
      inotify_rm_watch(this->inotify_fd,this->wd);
      iVar3 = inotify_add_watch(this->inotify_fd,(this->file_name)._M_dataplus._M_p,0xc0c);
      this->wd = iVar3;
      goto LAB_00102a51;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return bVar6;
  }
LAB_00102a5f:
  operator_delete__(__buf);
  return false;
}

Assistant:

bool fileWatcher::watchOnce() {
    char *a = new char[(10 * (sizeof(struct inotify_event) + file_name.size() + 1))];
    auto readnum = read(inotify_fd, a, 100);
    if(readnum > 0) {
        unsigned int mask  = 0;
        for(auto c = a; c < a + readnum;) {
            auto event = (struct inotify_event *) c;
            if(event->wd == this->wd) {
                mask |= event->mask;
            }
            c += sizeof(struct inotify_event) + event->len;
        }
        if((mask & IN_IGNORED) == 0 &&
                (mask & IN_CLOSE_WRITE)) {
            // 在文件被写入关闭或者文件被覆盖的时候说明文件被修改
            delete[] a;
            return true;
        } else if(mask & IN_DELETE_SELF  || mask & IN_MOVE_SELF) {
            // 如果你使用mv命令覆盖文件，文件
            // 只是发生了一次没有读入的写,此
            // 时只会触发此处
            stopWatch();
            startWatch();
            delete[] a;
            return true;
        } else if(mask & IN_ATTRIB) {
            // 一些编辑器(比如vim)使用文件覆盖的方法
            // 写入文件，此时需要重新启动一次读
            stopWatch();
            startWatch();
            delete[] a;
            return false;
        }

    }
    delete[] a;
    return false;
}